

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SerialSimulationDataGenerator::CreateSerialByte(SerialSimulationDataGenerator *this,U64 value)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint local_2c;
  BitExtractor local_28 [4];
  U32 i;
  BitExtractor bit_extractor;
  uint local_1c;
  U64 UStack_18;
  U32 num_bits;
  U64 value_local;
  SerialSimulationDataGenerator *this_local;
  
  SimulationChannelDescriptor::Transition();
  iVar1 = (int)this;
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptor::Advance(iVar1 + 0x40);
  UStack_18 = value;
  if ((this->mSettings->mInverted & 1U) == 1) {
    UStack_18 = value ^ 0xffffffffffffffff;
  }
  local_1c = this->mSettings->mBitsPerTransfer;
  if (this->mSettings->mSerialMode != Normal) {
    local_1c = local_1c + 1;
  }
  BitExtractor::BitExtractor(local_28,UStack_18,this->mSettings->mShiftOrder,local_1c);
  for (local_2c = 0; local_2c < local_1c; local_2c = local_2c + 1) {
    BitExtractor::GetNextBit();
    SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x40);
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x40);
  }
  if (this->mSettings->mParity == Even) {
    uVar3 = AnalyzerHelpers::GetOnesCount(UStack_18);
    bVar2 = AnalyzerHelpers::IsEven((ulong)uVar3);
    if ((bVar2 & 1) == 1) {
      SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x40);
    }
    else {
      SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x40);
    }
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x40);
  }
  else if (this->mSettings->mParity == Odd) {
    uVar3 = AnalyzerHelpers::GetOnesCount(UStack_18);
    bVar2 = AnalyzerHelpers::IsOdd((ulong)uVar3);
    if ((bVar2 & 1) == 1) {
      SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x40);
    }
    else {
      SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x40);
    }
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x40);
  }
  SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x40);
  ClockGenerator::AdvanceByHalfPeriod(this->mSettings->mStopBits);
  SimulationChannelDescriptor::Advance(iVar1 + 0x40);
  BitExtractor::~BitExtractor(local_28);
  return;
}

Assistant:

void SerialSimulationDataGenerator::CreateSerialByte( U64 value )
{
    // assume we start high

    mSerialSimulationData.Transition();                                     // low-going edge for start bit
    mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() ); // add start bit time

    if( mSettings->mInverted == true )
        value = ~value;

    U32 num_bits = mSettings->mBitsPerTransfer;
    if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        num_bits++;

    BitExtractor bit_extractor( value, mSettings->mShiftOrder, num_bits );

    for( U32 i = 0; i < num_bits; i++ )
    {
        mSerialSimulationData.TransitionIfNeeded( bit_extractor.GetNextBit() );
        mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }

    if( mSettings->mParity == AnalyzerEnums::Even )
    {
        if( AnalyzerHelpers::IsEven( AnalyzerHelpers::GetOnesCount( value ) ) == true )
            mSerialSimulationData.TransitionIfNeeded( mBitLow ); // we want to add a zero bit
        else
            mSerialSimulationData.TransitionIfNeeded( mBitHigh ); // we want to add a one bit

        mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }
    else if( mSettings->mParity == AnalyzerEnums::Odd )
    {
        if( AnalyzerHelpers::IsOdd( AnalyzerHelpers::GetOnesCount( value ) ) == true )
            mSerialSimulationData.TransitionIfNeeded( mBitLow ); // we want to add a zero bit
        else
            mSerialSimulationData.TransitionIfNeeded( mBitHigh );

        mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }

    mSerialSimulationData.TransitionIfNeeded( mBitHigh ); // we need to end high

    // let's pad the end a bit for the stop bit:
    mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( mSettings->mStopBits ) );
}